

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::CoverIsAccumulatedFromCellsAtTheSamePosition(RendererTests *this)

{
  bypass_alpha *this_00;
  int area_00;
  uint uVar1;
  int length;
  cell *pcVar2;
  bool bVar3;
  allocator local_161;
  string local_160 [32];
  LocationInfo local_140;
  undefined1 auStack_118 [8];
  span reference [3];
  undefined1 auStack_d8 [8];
  cell cells [7];
  undefined1 local_78 [8];
  scanline_mockup sl;
  RendererTests *this_local;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  
  sl._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)local_78,true);
  cells[4].cover = 0;
  cells[5].x = -0xd;
  cells[5].area = 0x794;
  cells[5].cover = 0;
  cells[3].area = 0x777;
  cells[3].cover = 0;
  cells[4].x = 0x11;
  cells[4].area = 0x78b;
  cells[2].x = -10;
  cells[2].area = 10;
  cells[2].cover = 0;
  cells[3].x = -3;
  cells[0].cover = 0;
  cells[1].x = 3;
  cells[1].area = 10;
  cells[1].cover = 0;
  auStack_d8._0_4_ = 7;
  auStack_d8._4_4_ = 0;
  cells[0].x = 10;
  cells[0].area = 7;
  cells[6].x = -4;
  _area = begin<agge::tests::mocks::cell,7ul>((cell (*) [7])auStack_d8);
  pcVar2 = end<agge::tests::mocks::cell,7ul>((cell (*) [7])auStack_d8);
  this_00 = (bypass_alpha *)((long)&reference[2].length + 3);
  i._4_4_ = 0;
  if (_area != pcVar2) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar3 = false;
        if (_area != pcVar2) {
          bVar3 = _area->x == cover_m;
        }
      } while (bVar3);
      area_00 = i._4_4_ * 0x200;
      if (len != 0) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_78,cover_m,uVar1);
        cover_m = cover_m + 1;
      }
      if (_area == pcVar2) break;
      length = _area->x - cover_m;
      if ((length != 0) && (area_00 != 0)) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00);
        anon_unknown_1::scanline_mockup::add_span((scanline_mockup *)local_78,cover_m,length,uVar1);
      }
    }
  }
  reference[1].length = 0x7fffffff;
  reference[1].cover = 0x78b;
  reference[2].y = 9;
  reference[2].x = 0x800;
  reference[0].length = 0x7fffffff;
  reference[0].cover = 0x777;
  reference[1].y = 0x14;
  reference[1].x = 0x2200;
  auStack_118._0_4_ = 0x7fffffff;
  auStack_118._4_4_ = 7;
  reference[0].y = 3;
  reference[0].x = 0x1a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_161);
  ut::LocationInfo::LocationInfo(&local_140,(string *)local_160,0xae);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [3])auStack_118,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl,&local_140);
  ut::LocationInfo::~LocationInfo(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)local_78);
  return;
}

Assistant:

test( CoverIsAccumulatedFromCellsAtTheSamePosition )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = {
					{ 7, 0, 10 }, { 7, 0, 3 }, { 10, 0, -10 }, { 10, 0, -3 },
					{ 1911, 0, 17 }, { 1931, 0, -13 }, { 1940, 0, -4 },
				};

				// ACT
				sweep_scanline<8>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference[] = {
					{ 0x7fffffff, 7, 3, 13 * 512 },
					{ 0x7fffffff, 1911, 20, 17 * 512 },
					{ 0x7fffffff, 1931, 9, 4 * 512 },
				};

				assert_equal(reference, sl.spans_log);
			}